

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool
replace_item_in_object(cJSON *object,char *string,cJSON *replacement,cJSON_bool case_sensitive)

{
  byte *pbVar1;
  cJSON_bool in_EAX;
  cJSON_bool cVar2;
  uchar *puVar3;
  cJSON *item;
  internal_hooks *hooks;
  
  if (replacement != (cJSON *)0x0) {
    hooks = (internal_hooks *)string;
    if (((replacement->type & 0x200) == 0) && (replacement->string != (char *)0x0)) {
      (*global_hooks.deallocate)(replacement->string);
    }
    puVar3 = cJSON_strdup((uchar *)string,hooks);
    replacement->string = (char *)puVar3;
    pbVar1 = (byte *)((long)&replacement->type + 1);
    *pbVar1 = *pbVar1 & 0xfd;
    item = get_object_item(object,string,case_sensitive);
    cVar2 = cJSON_ReplaceItemViaPointer(object,item,replacement);
    return cVar2;
  }
  return in_EAX;
}

Assistant:

static cJSON_bool replace_item_in_object(cJSON *object, const char *string, cJSON *replacement, cJSON_bool case_sensitive)
{
    if (replacement == NULL)
    {
        return false;
    }

    /* replace the name in the replacement */
    if (!(replacement->type & cJSON_StringIsConst) && (replacement->string != NULL))
    {
        cJSON_free(replacement->string);
    }
    replacement->string = (char*)cJSON_strdup((const unsigned char*)string, &global_hooks);
    replacement->type &= ~cJSON_StringIsConst;

    cJSON_ReplaceItemViaPointer(object, get_object_item(object, string, case_sensitive), replacement);

    return true;
}